

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_collection.cpp
# Opt level: O1

void duckdb::TemplatedColumnDataCopy<duckdb::StructValueCopy>
               (ColumnDataMetaData *meta_data,UnifiedVectorFormat *source_data,Vector *source,
               idx_t offset,idx_t count)

{
  ushort uVar1;
  sel_t *psVar2;
  unsigned_long *puVar3;
  byte bVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  reference pvVar7;
  ColumnDataAllocator *this;
  TemplatedValidityData<unsigned_long> *pTVar8;
  long lVar9;
  VectorDataIndex VVar10;
  ulong uVar11;
  long lVar12;
  _Head_base<0UL,_unsigned_long_*,_false> local_b8;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> local_b0;
  unsigned_long local_a0;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  unsigned_long local_88;
  ColumnDataMetaData *local_80;
  LogicalType *local_78;
  ColumnDataAppendState *local_70;
  ColumnDataCollectionSegment *local_68;
  vector<duckdb::VectorMetaData,_true> *local_60;
  VectorDataIndex local_58;
  ulong local_50;
  reference local_48;
  ulong local_40;
  ulong local_38;
  
  if (count != 0) {
    local_68 = meta_data->segment;
    local_70 = meta_data->state;
    VVar10.index = (meta_data->vector_data_index).index;
    local_60 = &local_68->vector_data;
    local_78 = &source->type;
    local_80 = meta_data;
    do {
      pvVar7 = vector<duckdb::VectorMetaData,_true>::operator[](local_60,VVar10.index);
      local_40 = (ulong)(0x800 - pvVar7->count);
      uVar11 = count;
      if (local_40 < count) {
        uVar11 = local_40;
      }
      this = shared_ptr<duckdb::ColumnDataAllocator,_true>::operator->(&local_68->allocator);
      local_b8._M_head_impl =
           (unsigned_long *)
           ColumnDataAllocator::GetDataPointer
                     (this,&local_70->current_chunk_state,pvVar7->block_id,pvVar7->offset);
      local_b0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      local_b0.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_a0 = 0x800;
      local_50 = uVar11;
      local_48 = pvVar7;
      if (pvVar7->count == 0) {
        if (local_b8._M_head_impl == (unsigned_long *)0x0) {
          local_88 = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_98,&local_88);
          p_Var6 = p_Stack_90;
          local_b0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = local_98;
          _Var5._M_pi = local_b0.internal.
                        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
          local_98 = (element_type *)0x0;
          p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_b0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var6;
          if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
          }
          if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&local_b0);
          local_b8._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        }
        switchD_0105b559::default(local_b8._M_head_impl,0xff,0x100);
      }
      pvVar7 = local_48;
      local_58.index = VVar10.index;
      local_38 = count;
      if (((source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) && (local_40 != 0)) {
        lVar9 = local_50 + (local_50 == 0);
        lVar12 = 0;
        do {
          psVar2 = source_data->sel->sel_vector;
          if (psVar2 == (sel_t *)0x0) {
            uVar11 = lVar12 + offset;
          }
          else {
            uVar11 = (ulong)psVar2[offset + lVar12];
          }
          puVar3 = (source_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar3 != (unsigned_long *)0x0) &&
             ((puVar3[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0)) {
            uVar1 = pvVar7->count;
            if (local_b8._M_head_impl == (unsigned_long *)0x0) {
              local_88 = local_a0;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_98,&local_88);
              p_Var6 = p_Stack_90;
              local_b0.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_98;
              _Var5._M_pi = local_b0.internal.
                            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi;
              local_98 = (element_type *)0x0;
              p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_b0.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var6;
              if (_Var5._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var5._M_pi);
              }
              if (p_Stack_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_90);
              }
              pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                 (&local_b0);
              local_b8._M_head_impl =
                   (pTVar8->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
              pvVar7 = local_48;
            }
            uVar11 = (ulong)uVar1 + lVar12;
            bVar4 = (byte)uVar11 & 0x3f;
            local_b8._M_head_impl[uVar11 >> 6] =
                 local_b8._M_head_impl[uVar11 >> 6] &
                 (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
          }
          lVar12 = lVar12 + 1;
        } while (lVar9 != lVar12);
      }
      uVar11 = local_50;
      VVar10.index = local_58.index;
      pvVar7->count = pvVar7->count + (short)local_50;
      count = local_38 - local_50;
      if (count != 0) {
        if ((pvVar7->next_data).index == 0xffffffffffffffff) {
          ColumnDataCollectionSegment::AllocateVector
                    (local_68,local_78,local_80->chunk_data,&local_70->current_chunk_state,local_58)
          ;
        }
        pvVar7 = vector<duckdb::VectorMetaData,_true>::operator[](local_60,VVar10.index);
        VVar10.index = (pvVar7->next_data).index;
      }
      if (local_b0.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      offset = offset + uVar11;
    } while (count != 0);
  }
  return;
}

Assistant:

static void TemplatedColumnDataCopy(ColumnDataMetaData &meta_data, const UnifiedVectorFormat &source_data,
                                    Vector &source, idx_t offset, idx_t count) {
	auto &segment = meta_data.segment;
	auto &append_state = meta_data.state;

	auto current_index = meta_data.vector_data_index;
	idx_t remaining = count;
	while (remaining > 0) {
		auto &current_segment = segment.GetVectorData(current_index);
		idx_t append_count = MinValue<idx_t>(STANDARD_VECTOR_SIZE - current_segment.count, remaining);

		auto base_ptr = segment.allocator->GetDataPointer(append_state.current_chunk_state, current_segment.block_id,
		                                                  current_segment.offset);
		auto validity_data = ColumnDataCollectionSegment::GetValidityPointerForWriting(base_ptr, OP::TypeSize());

		ValidityMask result_validity(validity_data, STANDARD_VECTOR_SIZE);
		if (current_segment.count == 0) {
			// first time appending to this vector
			// all data here is still uninitialized
			// initialize the validity mask to set all to valid
			result_validity.SetAllValid(STANDARD_VECTOR_SIZE);
		}
		if (source_data.validity.AllValid()) {
			// Fast path: all valid
			for (idx_t i = 0; i < append_count; i++) {
				auto source_idx = source_data.sel->get_index(offset + i);
				OP::template Assign<OP>(meta_data, base_ptr, source_data.data, current_segment.count + i, source_idx);
			}
		} else {
			for (idx_t i = 0; i < append_count; i++) {
				auto source_idx = source_data.sel->get_index(offset + i);
				if (source_data.validity.RowIsValid(source_idx)) {
					OP::template Assign<OP>(meta_data, base_ptr, source_data.data, current_segment.count + i,
					                        source_idx);
				} else {
					result_validity.SetInvalid(current_segment.count + i);
				}
			}
		}
		current_segment.count += append_count;
		offset += append_count;
		remaining -= append_count;
		if (remaining > 0) {
			// need to append more, check if we need to allocate a new vector or not
			if (!current_segment.next_data.IsValid()) {
				segment.AllocateVector(source.GetType(), meta_data.chunk_data, append_state, current_index);
			}
			D_ASSERT(segment.GetVectorData(current_index).next_data.IsValid());
			current_index = segment.GetVectorData(current_index).next_data;
		}
	}
}